

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSingularFieldHasBits
          (MessageGenerator *this,FieldDescriptor *field,Formatter *format)

{
  bool bVar1;
  int iVar2;
  CppType CVar3;
  LogMessage *other;
  char *pcVar4;
  allocator local_79;
  LogMessage local_78;
  Hex local_40;
  
  if (*(char *)(*(long *)(field + 0x38) + 0x4f) == '\x01') {
    pcVar4 = 
    "inline bool $classname$::has_$name$() const {\n$annotate_has$  return _weak_field_map_.Has($number$);\n}\n"
    ;
LAB_002d5954:
    Formatter::operator()<>(format,pcVar4);
    return;
  }
  bVar1 = HasHasbit(field);
  if (bVar1) {
    iVar2 = HasBitIndex(this,field);
    if (iVar2 == -1) {
      internal::LogMessage::LogMessage
                (&local_78,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                 ,0x468);
      other = internal::LogMessage::operator<<
                        (&local_78,"CHECK failed: (has_bit_index) != (kNoHasbit): ");
      internal::LogFinisher::operator=((LogFinisher *)&local_40,other);
      internal::LogMessage::~LogMessage(&local_78);
    }
    std::__cxx11::string::string((string *)&local_78,"has_array_index",&local_79);
    local_40.value = CONCAT44(local_40.value._4_4_,iVar2 / 0x20);
    Formatter::Set<int>(format,(string *)&local_78,(int *)&local_40);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::string((string *)&local_78,"has_mask",&local_79);
    local_40.value = (uint64)(uint)(1 << ((byte)iVar2 & 0x1f));
    local_40.spec = ZERO_PAD_8;
    Formatter::Set<google::protobuf::strings::Hex>(format,(string *)&local_78,&local_40);
    std::__cxx11::string::~string((string *)&local_78);
    Formatter::operator()<>
              (format,
               "inline bool $classname$::_internal_has_$name$() const {\n  bool value = (_has_bits_[$has_array_index$] & 0x$has_mask$u) != 0;\n"
              );
    CVar3 = FieldDescriptor::cpp_type(field);
    if (CVar3 == CPPTYPE_MESSAGE) {
      bVar1 = IsLazy(field,&this->options_,this->scc_analyzer_);
      if (!bVar1) {
        Formatter::operator()<>(format,"  PROTOBUF_ASSUME(!value || $name$_ != nullptr);\n");
      }
    }
    Formatter::operator()<>
              (format,
               "  return value;\n}\ninline bool $classname$::has_$name$() const {\n$annotate_has$  return _internal_has_$name$();\n}\n"
              );
  }
  else {
    CVar3 = FieldDescriptor::cpp_type(field);
    if (CVar3 == CPPTYPE_MESSAGE) {
      bVar1 = IsLazy(field,&this->options_,this->scc_analyzer_);
      pcVar4 = 
      "inline bool $classname$::_internal_has_$name$() const {\n  return this != internal_default_instance() && $name$_ != nullptr;\n}\n"
      ;
      if (bVar1) {
        pcVar4 = 
        "inline bool $classname$::_internal_has_$name$() const {\n  return !$name$_.IsCleared();\n}\n"
        ;
      }
      Formatter::operator()<>(format,pcVar4);
      pcVar4 = 
      "inline bool $classname$::has_$name$() const {\n$annotate_has$  return _internal_has_$name$();\n}\n"
      ;
      goto LAB_002d5954;
    }
  }
  return;
}

Assistant:

void MessageGenerator::GenerateSingularFieldHasBits(
    const FieldDescriptor* field, Formatter format) {
  if (IsFieldStripped(field, options_)) {
    format(
        "inline bool $classname$::has_$name$() const { "
        "__builtin_trap(); }\n");
    return;
  }
  if (field->options().weak()) {
    format(
        "inline bool $classname$::has_$name$() const {\n"
        "$annotate_has$"
        "  return _weak_field_map_.Has($number$);\n"
        "}\n");
    return;
  }
  if (HasHasbit(field)) {
    int has_bit_index = HasBitIndex(field);
    GOOGLE_CHECK_NE(has_bit_index, kNoHasbit);

    format.Set("has_array_index", has_bit_index / 32);
    format.Set("has_mask",
               strings::Hex(1u << (has_bit_index % 32), strings::ZERO_PAD_8));
    format(
        "inline bool $classname$::_internal_has_$name$() const {\n"
        "  bool value = "
        "(_has_bits_[$has_array_index$] & 0x$has_mask$u) != 0;\n");

    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
        !IsLazy(field, options_, scc_analyzer_)) {
      // We maintain the invariant that for a submessage x, has_x() returning
      // true implies that x_ is not null. By giving this information to the
      // compiler, we allow it to eliminate unnecessary null checks later on.
      format("  PROTOBUF_ASSUME(!value || $name$_ != nullptr);\n");
    }

    format(
        "  return value;\n"
        "}\n"
        "inline bool $classname$::has_$name$() const {\n"
        "$annotate_has$"
        "  return _internal_has_$name$();\n"
        "}\n");
  } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
    // Message fields have a has_$name$() method.
    if (IsLazy(field, options_, scc_analyzer_)) {
      format(
          "inline bool $classname$::_internal_has_$name$() const {\n"
          "  return !$name$_.IsCleared();\n"
          "}\n");
    } else {
      format(
          "inline bool $classname$::_internal_has_$name$() const {\n"
          "  return this != internal_default_instance() "
          "&& $name$_ != nullptr;\n"
          "}\n");
    }
    format(
        "inline bool $classname$::has_$name$() const {\n"
        "$annotate_has$"
        "  return _internal_has_$name$();\n"
        "}\n");
  }
}